

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O2

void caffe::UpgradeNetBatchNorm(NetParameter *net_param)

{
  RepeatedPtrField<caffe::LayerParameter> *this;
  bool bVar1;
  Type *pTVar2;
  Type *pTVar3;
  int i;
  int index;
  int ip;
  int index_00;
  
  this = &net_param->layer_;
  for (index = 0; index < (net_param->layer_).super_RepeatedPtrFieldBase.current_size_;
      index = index + 1) {
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                       (&this->super_RepeatedPtrFieldBase,index);
    bVar1 = std::operator==((pTVar2->type_).ptr_,"BatchNorm");
    if (bVar1) {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,index);
      if ((pTVar2->param_).super_RepeatedPtrFieldBase.current_size_ == 3) {
        index_00 = 0;
        while( true ) {
          pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                             (&this->super_RepeatedPtrFieldBase,index);
          if ((pTVar2->param_).super_RepeatedPtrFieldBase.current_size_ <= index_00) break;
          pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                             (&this->super_RepeatedPtrFieldBase,index);
          pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<caffe::ParamSpec>::TypeHandler>
                             (&(pTVar2->param_).super_RepeatedPtrFieldBase,index_00);
          *(byte *)(pTVar3->_has_bits_).has_bits_ = (byte)(pTVar3->_has_bits_).has_bits_[0] | 0xc;
          pTVar3->lr_mult_ = 0.0;
          pTVar3->decay_mult_ = 0.0;
          index_00 = index_00 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void UpgradeNetBatchNorm(NetParameter* net_param) {
  for (int i = 0; i < net_param->layer_size(); ++i) {
    // Check if BatchNorm layers declare three parameters, as required by
    // the previous BatchNorm layer definition.
    if (net_param->layer(i).type() == "BatchNorm"
        && net_param->layer(i).param_size() == 3) {
      // set lr_mult and decay_mult to zero. leave all other param intact.
      for (int ip = 0; ip < net_param->layer(i).param_size(); ip++) {
        ParamSpec* fixed_param_spec =
          net_param->mutable_layer(i)->mutable_param(ip);
        fixed_param_spec->set_lr_mult(0.f);
        fixed_param_spec->set_decay_mult(0.f);
      }
    }
  }
}